

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

void __thiscall
ParamListStandardOut::assignMap
          (ParamListStandardOut *this,vector<Datatype_*,_std::allocator<Datatype_*>_> *proto,
          bool isinput,TypeFactory *typefactory,
          vector<ParameterPieces,_std::allocator<ParameterPieces>_> *res)

{
  pointer ppDVar1;
  pointer pPVar2;
  AddrSpace *pAVar3;
  TypePointer *status_00;
  LowlevelError *this_00;
  vector<int,_std::allocator<int>_> status;
  allocator_type local_69;
  undefined1 local_68 [32];
  vector<int,_std::allocator<int>_> local_48;
  
  local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)(this->super_ParamListStandard).numgroup,
             (value_type_conflict2 *)local_68,&local_69);
  local_68._16_8_ = (Datatype *)0x0;
  local_68._24_8_ = 0;
  local_68._0_8_ = (AddrSpace *)0x0;
  local_68._8_8_ = 0;
  std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
            (res,(ParameterPieces *)local_68);
  ppDVar1 = (proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
  super__Vector_impl_data._M_finish[-1].type = *ppDVar1;
  (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
  super__Vector_impl_data._M_finish[-1].flags = 0;
  if ((*ppDVar1)->metatype != TYPE_VOID) {
    ParamListStandard::assignAddress
              ((ParamListStandard *)local_68,(Datatype *)this,
               (vector<int,_std::allocator<int>_> *)*ppDVar1);
    pPVar2 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar2[-1].addr.base = (AddrSpace *)local_68._0_8_;
    pPVar2[-1].addr.offset = local_68._8_8_;
    if ((res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1].addr.base == (AddrSpace *)0x0) {
      pAVar3 = (this->super_ParamListStandard).spacebase;
      if (pAVar3 == (AddrSpace *)0x0) {
        pAVar3 = (typefactory->glb->super_AddrSpaceManager).defaultspace;
      }
      status_00 = TypeFactory::getTypePointerAbsolute
                            (typefactory,pAVar3->addressSize,
                             *(proto->super__Vector_base<Datatype_*,_std::allocator<Datatype_*>_>).
                              _M_impl.super__Vector_impl_data._M_start,pAVar3->wordsize);
      ParamListStandard::assignAddress
                ((ParamListStandard *)local_68,(Datatype *)this,
                 (vector<int,_std::allocator<int>_> *)status_00);
      pPVar2 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pPVar2[-1].addr.base = (AddrSpace *)local_68._0_8_;
      pPVar2[-1].addr.offset = local_68._8_8_;
      pPVar2 = (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pPVar2[-1].addr.base == (AddrSpace *)0x0) {
        this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
        local_68._0_8_ = local_68 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Cannot assign return value as a pointer","");
        LowlevelError::LowlevelError(this_00,(string *)local_68);
        __cxa_throw(this_00,&ParamUnassignedError::typeinfo,LowlevelError::~LowlevelError);
      }
      pPVar2[-1].type = &status_00->super_Datatype;
      (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
      super__Vector_impl_data._M_finish[-1].flags = 0x10000000;
      local_68._16_8_ = (Datatype *)0x0;
      local_68._24_8_ = 0;
      local_68._0_8_ = (AddrSpace *)0x0;
      local_68._8_8_ = 0;
      std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
                (res,(ParameterPieces *)local_68);
      (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
      super__Vector_impl_data._M_finish[-1].type = &status_00->super_Datatype;
      (res->super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>)._M_impl.
      super__Vector_impl_data._M_finish[-1].flags = 0x20000000;
    }
  }
  if ((_List_node_base *)
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (_List_node_base *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ParamListStandardOut::assignMap(const vector<Datatype *> &proto,bool isinput,
				     TypeFactory &typefactory,vector<ParameterPieces> &res) const
{
  vector<int4> status(numgroup,0);

  // This is always an output list so we ignore -isinput-
  res.push_back(ParameterPieces());
  res.back().type = proto[0];
  res.back().flags = 0;
  if (proto[0]->getMetatype() == TYPE_VOID) {
    return;			// Leave the address as invalid
  }
  res.back().addr = assignAddress(proto[0],status);
  if (res.back().addr.isInvalid()) { // Could not assign an address (too big)
    AddrSpace *spc = spacebase;
    if (spc == (AddrSpace *)0)
      spc = typefactory.getArch()->getDefaultSpace();
    int4 pointersize = spc->getAddrSize();
    int4 wordsize = spc->getWordSize();
    Datatype *pointertp = typefactory.getTypePointerAbsolute(pointersize, proto[0], wordsize);
    res.back().addr = assignAddress(pointertp,status);
    if (res.back().addr.isInvalid())
      throw ParamUnassignedError("Cannot assign return value as a pointer");
    res.back().type = pointertp;
    res.back().flags = Varnode::indirectstorage;

    res.push_back(ParameterPieces()); // Add extra storage location in the input params
    res.back().type = pointertp;      // that holds a pointer to where the return value should be stored
    // leave its address invalid, to be filled in by the input list assignMap
    res.back().flags = Varnode::hiddenretparm; // Mark it as special 
  }
}